

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

StringRef llvm::sys::detail::getHostCPUNameForS390x(StringRef ProcCpuinfoContent)

{
  type_conflict1 tVar1;
  size_t sVar2;
  ulong uVar3;
  undefined8 *puVar4;
  size_t sVar5;
  StringRef *pSVar6;
  unsigned_long *puVar7;
  long *plVar8;
  char *pcVar9;
  bool bVar10;
  StringRef local_820;
  uint local_80c;
  undefined1 auStack_808 [4];
  uint Id;
  ulong local_7f8;
  size_t Pos_1;
  uint local_7e0;
  uint local_7dc;
  uint E_2;
  uint I_2;
  void *local_7c8;
  size_t local_7c0;
  uint local_7b4;
  uint local_7b0;
  uint E_1;
  uint I_1;
  bool HaveVectorSupport;
  unsigned_long local_7a0;
  StringRef local_798;
  size_t local_788;
  size_t Pos;
  uint local_770;
  uint local_76c;
  uint E;
  uint I;
  SmallVector<llvm::StringRef,_32U> CPUFeatures;
  undefined1 local_548 [8];
  SmallVector<llvm::StringRef,_32U> Lines;
  StringRef ProcCpuinfoContent_local;
  void *local_1a8;
  size_t local_1a0;
  SmallVectorBase *local_198;
  SmallVectorBase *local_190;
  SmallVectorBase *local_188;
  SmallVectorBase *local_180;
  SmallVectorBase *local_178;
  SmallVectorBase *local_170;
  SmallVectorBase *local_168;
  ulong local_160;
  long *local_158;
  char *local_150;
  unsigned_long local_148;
  unsigned_long local_140 [2];
  ulong local_130;
  long *local_128;
  undefined1 local_120 [16];
  unsigned_long local_110;
  char *local_108;
  undefined1 *local_100;
  ulong local_f8;
  long *local_f0;
  char *local_e8;
  unsigned_long local_e0;
  unsigned_long local_d8 [2];
  ulong local_c8;
  long *local_c0;
  undefined1 local_b8 [16];
  unsigned_long local_a8;
  char *local_a0;
  undefined1 *local_98;
  size_t local_90;
  size_t local_88;
  void *local_80;
  int local_74;
  size_t local_70;
  size_t local_68;
  void *local_60;
  int local_54;
  void **local_50;
  char *local_48;
  size_t local_40;
  size_t local_38;
  char *local_30;
  void *local_28;
  int local_1c;
  long *local_18;
  long *local_10;
  
  Lines.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
  super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = ProcCpuinfoContent.Data;
  SmallVector<llvm::StringRef,_32U>::SmallVector((SmallVector<llvm::StringRef,_32U> *)local_548);
  strlen("\n");
  StringRef::split((StringRef *)
                   (Lines.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                    super_AlignedCharArray<8UL,_16UL>.buffer + 8),
                   (SmallVectorImpl<llvm::StringRef> *)local_548,stack0xfffffffffffffaa8,-1,true);
  SmallVector<llvm::StringRef,_32U>::SmallVector((SmallVector<llvm::StringRef,_32U> *)&E);
  local_76c = 0;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)local_548);
  local_770 = (uint)sVar2;
  for (; local_76c != local_770; local_76c = local_76c + 1) {
    uVar3 = (ulong)local_76c;
    sVar2 = SmallVectorBase::size((SmallVectorBase *)local_548);
    if (sVar2 <= uVar3) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    puVar4 = (undefined8 *)((long)local_548 + uVar3 * 0x10);
    Pos = (size_t)anon_var_dwarf_e49f5;
    local_198 = (SmallVectorBase *)local_548;
    sVar5 = strlen("features");
    bVar10 = false;
    if (sVar5 <= (ulong)puVar4[1]) {
      local_80 = (void *)*puVar4;
      local_88 = Pos;
      local_90 = sVar5;
      if (sVar5 == 0) {
        local_74 = 0;
      }
      else {
        local_74 = memcmp(local_80,(void *)Pos,sVar5);
      }
      bVar10 = local_74 == 0;
    }
    if (bVar10) {
      uVar3 = (ulong)local_76c;
      sVar2 = SmallVectorBase::size((SmallVectorBase *)local_548);
      if (sVar2 <= uVar3) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                     );
      }
      pSVar6 = (StringRef *)((long)local_548 + uVar3 * 0x10);
      local_190 = (SmallVectorBase *)local_548;
      strlen(":");
      local_788 = StringRef::find(pSVar6,local_798,0);
      if (local_788 != 0xffffffffffffffff) {
        uVar3 = (ulong)local_76c;
        sVar2 = SmallVectorBase::size((SmallVectorBase *)local_548);
        if (sVar2 <= uVar3) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        plVar8 = (long *)((long)local_548 + uVar3 * 0x10);
        local_f8 = local_788 + 1;
        local_188 = (SmallVectorBase *)local_548;
        local_f0 = plVar8;
        local_18 = plVar8;
        if ((ulong)plVar8[1] < local_f8) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                        ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        local_d8[1] = 0xffffffffffffffff;
        local_c8 = local_f8;
        local_c0 = plVar8;
        puVar7 = std::min<unsigned_long>(&local_c8,(unsigned_long *)(plVar8 + 1));
        local_c8 = *puVar7;
        pcVar9 = (char *)(*plVar8 + local_c8);
        local_d8[0] = plVar8[1] - local_c8;
        puVar7 = std::min<unsigned_long>(local_d8 + 1,local_d8);
        local_7a0 = *puVar7;
        local_98 = local_b8;
        _I_1 = pcVar9;
        local_e8 = pcVar9;
        local_e0 = local_7a0;
        local_a8 = local_7a0;
        local_a0 = pcVar9;
        StringRef::split((StringRef *)&I_1,(SmallVectorImpl<llvm::StringRef> *)&E,' ',-1,true);
        break;
      }
    }
  }
  E_1._3_1_ = 0;
  local_7b0 = 0;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)&E);
  local_7b4 = (uint)sVar2;
  for (; local_7b0 != local_7b4; local_7b0 = local_7b0 + 1) {
    uVar3 = (ulong)local_7b0;
    sVar2 = SmallVectorBase::size((SmallVectorBase *)&E);
    if (sVar2 <= uVar3) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    puVar4 = (undefined8 *)((long)_E + uVar3 * 0x10);
    local_7c8 = (void *)*puVar4;
    local_7c0 = puVar4[1];
    _E_2 = "vx";
    local_180 = (SmallVectorBase *)&E;
    local_40 = strlen("vx");
    local_1a8 = local_7c8;
    local_1a0 = local_7c0;
    local_48 = _E_2;
    local_50 = &local_1a8;
    bVar10 = false;
    if (local_7c0 == local_40) {
      local_28 = local_7c8;
      local_30 = _E_2;
      local_38 = local_40;
      if (local_40 == 0) {
        local_1c = 0;
      }
      else {
        local_1c = memcmp(local_7c8,_E_2,local_40);
      }
      bVar10 = local_1c == 0;
    }
    if (bVar10) {
      E_1._3_1_ = 1;
    }
  }
  local_7dc = 0;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)local_548);
  local_7e0 = (uint)sVar2;
  do {
    if (local_7dc == local_7e0) {
LAB_001a6bd7:
      strlen("generic");
LAB_001a6c54:
      SmallVector<llvm::StringRef,_32U>::~SmallVector((SmallVector<llvm::StringRef,_32U> *)&E);
      SmallVector<llvm::StringRef,_32U>::~SmallVector
                ((SmallVector<llvm::StringRef,_32U> *)local_548);
      return stack0xfffffffffffffcd8;
    }
    uVar3 = (ulong)local_7dc;
    sVar2 = SmallVectorBase::size((SmallVectorBase *)local_548);
    if (sVar2 <= uVar3) {
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    puVar4 = (undefined8 *)((long)local_548 + uVar3 * 0x10);
    Pos_1 = (size_t)anon_var_dwarf_e4a16;
    local_178 = (SmallVectorBase *)local_548;
    sVar5 = strlen("processor ");
    bVar10 = false;
    if (sVar5 <= (ulong)puVar4[1]) {
      local_60 = (void *)*puVar4;
      local_68 = Pos_1;
      local_70 = sVar5;
      if (sVar5 == 0) {
        local_54 = 0;
      }
      else {
        local_54 = memcmp(local_60,(void *)Pos_1,sVar5);
      }
      bVar10 = local_54 == 0;
    }
    if (bVar10) {
      uVar3 = (ulong)local_7dc;
      sVar2 = SmallVectorBase::size((SmallVectorBase *)local_548);
      if (sVar2 <= uVar3) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                     );
      }
      pSVar6 = (StringRef *)((long)local_548 + uVar3 * 0x10);
      local_170 = (SmallVectorBase *)local_548;
      strlen("machine = ");
      local_7f8 = StringRef::find(pSVar6,_auStack_808,0);
      if (local_7f8 != 0xffffffffffffffff) {
        local_7f8 = local_7f8 + 10;
        uVar3 = (ulong)local_7dc;
        sVar2 = SmallVectorBase::size((SmallVectorBase *)local_548);
        if (sVar2 <= uVar3) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                       );
        }
        plVar8 = (long *)((long)local_548 + uVar3 * 0x10);
        local_160 = local_7f8;
        local_168 = (SmallVectorBase *)local_548;
        local_158 = plVar8;
        local_10 = plVar8;
        if ((ulong)plVar8[1] < local_7f8) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                        ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        local_130 = local_7f8;
        local_140[1] = 0xffffffffffffffff;
        local_128 = plVar8;
        puVar7 = std::min<unsigned_long>(&local_130,(unsigned_long *)(plVar8 + 1));
        local_130 = *puVar7;
        pcVar9 = (char *)(*plVar8 + local_130);
        local_140[0] = plVar8[1] - local_130;
        puVar7 = std::min<unsigned_long>(local_140 + 1,local_140);
        local_820.Length = *puVar7;
        local_100 = local_120;
        local_820.Data = pcVar9;
        local_150 = pcVar9;
        local_148 = local_820.Length;
        local_110 = local_820.Length;
        local_108 = pcVar9;
        tVar1 = StringRef::getAsInteger<unsigned_int>(&local_820,10,&local_80c);
        if (((tVar1 ^ 0xffU) & 1) != 0) {
          if ((0xf41 < local_80c) && ((E_1._3_1_ & 1) != 0)) {
            strlen("z14");
            goto LAB_001a6c54;
          }
          if ((0xb93 < local_80c) && ((E_1._3_1_ & 1) != 0)) {
            strlen("z13");
            goto LAB_001a6c54;
          }
          if (0xb0a < local_80c) {
            strlen("zEC12");
            goto LAB_001a6c54;
          }
          if (0xb00 < local_80c) {
            strlen("z196");
            goto LAB_001a6c54;
          }
        }
      }
      goto LAB_001a6bd7;
    }
    local_7dc = local_7dc + 1;
  } while( true );
}

Assistant:

StringRef sys::detail::getHostCPUNameForS390x(StringRef ProcCpuinfoContent) {
  // STIDP is a privileged operation, so use /proc/cpuinfo instead.

  // The "processor 0:" line comes after a fair amount of other information,
  // including a cache breakdown, but this should be plenty.
  SmallVector<StringRef, 32> Lines;
  ProcCpuinfoContent.split(Lines, "\n");

  // Look for the CPU features.
  SmallVector<StringRef, 32> CPUFeatures;
  for (unsigned I = 0, E = Lines.size(); I != E; ++I)
    if (Lines[I].startswith("features")) {
      size_t Pos = Lines[I].find(":");
      if (Pos != StringRef::npos) {
        Lines[I].drop_front(Pos + 1).split(CPUFeatures, ' ');
        break;
      }
    }

  // We need to check for the presence of vector support independently of
  // the machine type, since we may only use the vector register set when
  // supported by the kernel (and hypervisor).
  bool HaveVectorSupport = false;
  for (unsigned I = 0, E = CPUFeatures.size(); I != E; ++I) {
    if (CPUFeatures[I] == "vx")
      HaveVectorSupport = true;
  }

  // Now check the processor machine type.
  for (unsigned I = 0, E = Lines.size(); I != E; ++I) {
    if (Lines[I].startswith("processor ")) {
      size_t Pos = Lines[I].find("machine = ");
      if (Pos != StringRef::npos) {
        Pos += sizeof("machine = ") - 1;
        unsigned int Id;
        if (!Lines[I].drop_front(Pos).getAsInteger(10, Id)) {
          if (Id >= 3906 && HaveVectorSupport)
            return "z14";
          if (Id >= 2964 && HaveVectorSupport)
            return "z13";
          if (Id >= 2827)
            return "zEC12";
          if (Id >= 2817)
            return "z196";
        }
      }
      break;
    }
  }

  return "generic";
}